

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

size_t uv__min_stack_size(void)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = __sysconf(0x4b);
  if (0x2000 < uVar1) {
    sVar2 = __sysconf(0x4b);
    return sVar2;
  }
  return 0x2000;
}

Assistant:

static size_t uv__min_stack_size(void) {
  static const size_t min = 8192;

#ifdef PTHREAD_STACK_MIN  /* Not defined on NetBSD. */
  if (min < (size_t) PTHREAD_STACK_MIN)
    return PTHREAD_STACK_MIN;
#endif  /* PTHREAD_STACK_MIN */

  return min;
}